

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

int sat_solver_count_assigned(sat_solver *s)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((s->trail_lim).size == 0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)s->size;
    if (s->size < 1) {
      uVar2 = uVar3;
    }
    iVar1 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = iVar1 + (uint)(s->assigns[uVar3] != '\x03');
    }
    return iVar1;
  }
  __assert_fail("sat_solver_dl(s) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                ,0x2ea,"int sat_solver_count_assigned(sat_solver *)");
}

Assistant:

int sat_solver_count_assigned(sat_solver* s)
{
    // count top-level assignments
    int i, Count = 0;
    assert(sat_solver_dl(s) == 0);
    for ( i = 0; i < s->size; i++ )
        if (var_value(s, i) != varX)
            Count++;
    return Count;
}